

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

bool google::glog_internal_namespace_::is_default_thread(void)

{
  int iVar1;
  pthread_t __thread1;
  undefined1 local_9;
  
  if (g_program_invocation_short_name == 0) {
    local_9 = true;
  }
  else {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,g_main_thread_id);
    local_9 = iVar1 != 0;
  }
  return local_9;
}

Assistant:

bool is_default_thread() {
  if (g_program_invocation_short_name == NULL) {
    // InitGoogleLogging() not yet called, so unlikely to be in a different
    // thread
    return true;
  } else {
    return pthread_equal(pthread_self(), g_main_thread_id);
  }
}